

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_stdlib.cpp
# Opt level: O2

int InputTextCallback(ImGuiInputTextCallbackData *data)

{
  ulong *puVar1;
  long *plVar2;
  code *UNRECOVERED_JUMPTABLE;
  int iVar3;
  
  puVar1 = (ulong *)data->UserData;
  if (data->EventFlag == 0x40000) {
    plVar2 = (long *)*puVar1;
    if (data->Buf != (char *)*plVar2) {
      __assert_fail("data->Buf == str->c_str()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/misc/cpp/imgui_stdlib.cpp"
                    ,0x19,"int InputTextCallback(ImGuiInputTextCallbackData *)");
    }
    std::__cxx11::string::resize((ulong)plVar2);
    data->Buf = (char *)*plVar2;
  }
  else {
    UNRECOVERED_JUMPTABLE = (code *)puVar1[1];
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      data->UserData = (void *)puVar1[2];
      iVar3 = (*UNRECOVERED_JUMPTABLE)(data);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

static int InputTextCallback(ImGuiInputTextCallbackData* data)
{
    InputTextCallback_UserData* user_data = (InputTextCallback_UserData*)data->UserData;
    if (data->EventFlag == ImGuiInputTextFlags_CallbackResize)
    {
        // Resize string callback
        // If for some reason we refuse the new length (BufTextLen) and/or capacity (BufSize) we need to set them back to what we want.
        std::string* str = user_data->Str;
        IM_ASSERT(data->Buf == str->c_str());
        str->resize(data->BufTextLen);
        data->Buf = (char*)str->c_str();
    }
    else if (user_data->ChainCallback)
    {
        // Forward to user callback, if any
        data->UserData = user_data->ChainCallbackUserData;
        return user_data->ChainCallback(data);
    }
    return 0;
}